

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::GrowArrayHeadHelperForUnshift<int>
               (JavascriptArray *pArr,uint32 unshiftElements,ScriptContext *scriptContext)

{
  Type TVar1;
  Type TVar2;
  SparseArraySegmentBase *seg;
  bool bVar3;
  SparseArraySegmentBase *pSVar4;
  SparseArraySegmentBase **ppSVar5;
  Recycler *recycler_00;
  SparseArraySegment<int> *pSVar6;
  bool isInlineSegment;
  SparseArraySegmentBase *oldHead;
  Recycler *recycler;
  SparseArraySegmentBase *nextToHeadSeg;
  ScriptContext *scriptContext_local;
  uint32 unshiftElements_local;
  JavascriptArray *pArr_local;
  
  pSVar4 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar4->next);
  pSVar4 = *ppSVar5;
  recycler_00 = ScriptContext::GetRecycler(scriptContext);
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pArr->head);
  seg = *ppSVar5;
  bVar3 = IsInlineSegment(seg,pArr);
  if (pSVar4 == (SparseArraySegmentBase *)0x0) {
    EnsureHead<int>(pArr);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pArr->head);
    pSVar6 = SparseArraySegment<int>::From(*ppSVar5);
    pSVar4 = &SparseArraySegment<int>::GrowByMin(pSVar6,recycler_00,unshiftElements)->
              super_SparseArraySegmentBase;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pArr->head,pSVar4);
  }
  else {
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pArr->head);
    pSVar6 = SparseArraySegment<int>::From(*ppSVar5);
    TVar1 = pSVar4->left;
    pSVar4 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    TVar2 = pSVar4->left;
    pSVar4 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    pSVar4 = &SparseArraySegment<int>::GrowByMinMax
                        (pSVar6,recycler_00,unshiftElements,
                         ((TVar1 + unshiftElements) - TVar2) - pSVar4->size)->
              super_SparseArraySegmentBase;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pArr->head,pSVar4);
  }
  if (bVar3) {
    (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,seg,0);
  }
  return;
}

Assistant:

void JavascriptArray::GrowArrayHeadHelperForUnshift(JavascriptArray* pArr, uint32 unshiftElements, ScriptContext * scriptContext)
    {
        SparseArraySegmentBase* nextToHeadSeg = pArr->head->next;
        Recycler* recycler = scriptContext->GetRecycler();

        SparseArraySegmentBase *oldHead = pArr->head;
        bool isInlineSegment = JavascriptArray::IsInlineSegment(oldHead, pArr);
        if (nextToHeadSeg == nullptr)
        {
            pArr->EnsureHead<T>();
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMin(recycler, unshiftElements);
        }
        else
        {
            pArr->head = SparseArraySegment<T>::From(pArr->head)->GrowByMinMax(recycler, unshiftElements, ((nextToHeadSeg->left + unshiftElements) - pArr->head->left - pArr->head->size));
        }

        if (isInlineSegment)
        {
            pArr->ClearElements(oldHead, 0);
        }
    }